

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void EndTextureMode(void)

{
  rlDrawRenderBatchActive();
  (*glad_glBindFramebuffer)(0x8d40,0);
  SetupViewport(CORE.Window.render.width,CORE.Window.render.height);
  CORE.Window.currentFbo = CORE.Window.screen;
  return;
}

Assistant:

void EndTextureMode(void)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlDisableFramebuffer();         // Disable render target (fbo)

    // Set viewport to default framebuffer size
    SetupViewport(CORE.Window.render.width, CORE.Window.render.height);

    // Reset current fbo to screen size
    CORE.Window.currentFbo.width = CORE.Window.screen.width;
    CORE.Window.currentFbo.height = CORE.Window.screen.height;
}